

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

void IDAQuadFree(void *ida_mem)

{
  int iVar1;
  long lVar2;
  
  if ((ida_mem != (void *)0x0) && (*(int *)((long)ida_mem + 0x6a8) != 0)) {
    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x330));
    *(undefined8 *)((long)ida_mem + 0x330) = 0;
    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x338));
    *(undefined8 *)((long)ida_mem + 0x338) = 0;
    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x340));
    *(undefined8 *)((long)ida_mem + 0x340) = 0;
    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x348));
    *(undefined8 *)((long)ida_mem + 0x348) = 0;
    iVar1 = *(int *)((long)ida_mem + 0x560);
    if (-1 < iVar1) {
      lVar2 = -1;
      do {
        N_VDestroy(*(undefined8 *)((long)ida_mem + lVar2 * 8 + 0x308));
        *(undefined8 *)((long)ida_mem + lVar2 * 8 + 0x308) = 0;
        iVar1 = *(int *)((long)ida_mem + 0x560);
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    *(long *)((long)ida_mem + 0x678) =
         *(long *)((long)ida_mem + 0x678) - *(long *)((long)ida_mem + 0x668) * (long)(iVar1 + 5);
    *(long *)((long)ida_mem + 0x680) =
         *(long *)((long)ida_mem + 0x680) - (long)(iVar1 + 5) * *(long *)((long)ida_mem + 0x670);
    if (*(int *)((long)ida_mem + 0x6a4) != 0) {
      N_VDestroy(*(undefined8 *)((long)ida_mem + 0x90));
      *(undefined8 *)((long)ida_mem + 0x90) = 0;
      *(long *)((long)ida_mem + 0x678) =
           *(long *)((long)ida_mem + 0x678) - *(long *)((long)ida_mem + 0x668);
      *(long *)((long)ida_mem + 0x680) =
           *(long *)((long)ida_mem + 0x680) - *(long *)((long)ida_mem + 0x670);
    }
    *(undefined8 *)((long)ida_mem + 0x6a4) = 0;
    *(undefined4 *)((long)ida_mem + 0x60) = 0;
  }
  return;
}

Assistant:

void IDAQuadFree(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadMallocDone)
  {
    IDAQuadFreeVectors(IDA_mem);
    IDA_mem->ida_quadMallocDone = SUNFALSE;
    IDA_mem->ida_quadr          = SUNFALSE;
  }
}